

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractSyntaxTree.cpp
# Opt level: O0

void __thiscall MyCompiler::Factor::Factor(Factor *this)

{
  allocator local_31;
  string local_30 [32];
  Factor *local_10;
  Factor *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Factor",&local_31);
  AbstractAstNode::AbstractAstNode(&this->super_AbstractAstNode,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::shared_ptr<MyCompiler::Ident>::shared_ptr(&this->pIdent);
  std::shared_ptr<MyCompiler::Number>::shared_ptr(&this->pNumber);
  std::shared_ptr<MyCompiler::Expression>::shared_ptr(&this->pExpression);
  return;
}

Assistant:

MyCompiler::Factor::Factor()
        : AbstractAstNode("Factor")
{}